

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::restriction
          (MLNodeLaplacian *this,int amrlev,int cmglev,MultiFab *crse,MultiFab *fine)

{
  int iVar1;
  pointer pIVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  Periodicity *period;
  int iVar9;
  int iVar10;
  char cVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  undefined **ppuVar16;
  int iVar17;
  undefined4 in_register_00000034;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  int *piVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  long lVar43;
  ulong uVar44;
  long lVar45;
  bool bVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  undefined1 auVar93 [16];
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar117;
  undefined1 auVar111 [16];
  double dVar110;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar129;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  double dVar152;
  double dVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  double dVar159;
  double dVar160;
  double dVar161;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  double dVar162;
  double dVar174;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  double dVar175;
  double dVar176;
  double dVar177;
  undefined1 auVar180 [16];
  double dVar178;
  double dVar184;
  undefined1 auVar181 [16];
  double dVar179;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  double dVar185;
  double dVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  double dVar193;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  ulong in_stack_fffffffffffff8d8;
  long local_6d0;
  int kk_1;
  int jj;
  int kk_3;
  FabArray<amrex::FArrayBox> *local_598;
  Box local_534;
  int kk;
  undefined4 uStack_514;
  undefined8 uStack_510;
  MLNodeLaplacian *local_508;
  long local_500;
  undefined **local_4f8;
  undefined **local_4f0;
  long local_4e8;
  long local_4e0;
  Array4<double> cfab;
  Array4<const_double> local_498;
  Array4<const_int> local_458;
  double *local_418;
  undefined8 uStack_410;
  double *local_408;
  undefined8 uStack_400;
  double *local_3f8;
  undefined8 uStack_3f0;
  double *local_3e8;
  undefined8 uStack_3e0;
  double *local_3d8;
  undefined8 uStack_3d0;
  double local_3c8;
  undefined8 uStack_3c0;
  FabArray<amrex::FArrayBox> *local_3b0;
  long local_3a8;
  FabArray<amrex::IArrayBox> *local_3a0;
  long local_398;
  Long local_390;
  long local_388;
  long local_378;
  int *local_370;
  long local_368;
  double *local_360;
  ulong local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  double *local_330;
  int *local_328;
  undefined **local_320;
  double *local_318;
  double *local_310;
  double *local_308;
  double *local_300;
  double *local_2f8;
  double *local_2f0;
  double *local_2e8;
  double *local_2e0;
  double *local_2d8;
  double *local_2d0;
  double *local_2c8;
  double *local_2c0;
  double *local_2b8;
  double *local_2b0;
  double *local_2a8;
  double *local_2a0;
  double *local_298;
  double *local_290;
  double *local_288;
  double *local_280;
  double *local_278;
  undefined **local_270;
  double *local_268;
  undefined **local_260;
  MFIter mfi;
  Array4<const_double> local_1f0;
  MultiFab cfine;
  
  local_508 = this;
  (*(this->super_MLNodeLinOp).super_MLLinOp._vptr_MLLinOp[0x45])
            (this,CONCAT44(in_register_00000034,amrlev),(ulong)(cmglev - 1U),fine,0,0,
             in_stack_fffffffffffff8d8 & 0xffffffff00000000);
  bVar3 = isMFIterSafe((FabArrayBase *)crse,(FabArrayBase *)fine);
  MultiFab::MultiFab(&cfine);
  local_598 = &crse->super_FabArray<amrex::FArrayBox>;
  local_3b0 = &crse->super_FabArray<amrex::FArrayBox>;
  if (!bVar3) {
    amrex::coarsen((BoxArray *)&mfi,
                   &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,2);
    cfab.p = (double *)0x1;
    cfab.jstride = 0;
    cfab.kstride = 0;
    cfab.nstride = 0;
    cfab.begin.x = 0;
    cfab.begin.y = 0;
    local_498.p = (double *)&PTR__FabFactory_007d2928;
    local_598 = &cfine.super_FabArray<amrex::FArrayBox>;
    MultiFab::define((MultiFab *)local_598,(BoxArray *)&mfi,
                     &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,
                     0,(MFInfo *)&cfab,(FabFactory<amrex::FArrayBox> *)&local_498);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cfab.kstride);
    BoxArray::~BoxArray((BoxArray *)&mfi);
  }
  lVar22 = (long)(int)(cmglev - 1U);
  if (cmglev < 1) {
    bVar46 = true;
  }
  else {
    pIVar2 = (local_508->super_MLNodeLinOp).super_MLLinOp.mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pIVar2[lVar22].vect[1] != 2 || pIVar2[lVar22].vect[0] != 2) {
      if (pIVar2[lVar22].vect[1] == 1) {
        cVar11 = '\x01';
      }
      else {
        cVar11 = (pIVar2[lVar22].vect[0] != 1) * '\x02';
      }
      bVar46 = false;
      goto LAB_006011c0;
    }
    bVar46 = pIVar2[lVar22].vect[2] == 2;
  }
  cVar11 = '\x02';
LAB_006011c0:
  local_3a0 = *(FabArray<amrex::IArrayBox> **)
               (*(long *)&(local_508->super_MLNodeLinOp).m_dirichlet_mask.
                          super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[amrlev].
                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               + lVar22 * 8);
  local_3a8 = *(long *)&(local_508->m_stencil).
                        super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ;
  MFIter::MFIter(&mfi,&local_598->super_FabArrayBase,true);
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      if (!bVar3) {
        period = Periodicity::NonPeriodic();
        FabArray<amrex::FArrayBox>::ParallelCopy
                  (local_3b0,&cfine.super_FabArray<amrex::FArrayBox>,period,COPY);
      }
      MultiFab::~MultiFab(&cfine);
      return;
    }
    MFIter::tilebox(&local_534,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&cfab,local_598,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_498,&fine->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_458,local_3a0,&mfi);
    if ((local_508->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
      lVar8 = (long)local_534.smallend.vect[0];
      if (bVar46) {
        lVar33 = (long)local_534.smallend.vect[1];
        iVar9 = local_534.smallend.vect[2] * 2;
        iVar4 = local_534.smallend.vect[2] * 2 + 1;
        iVar10 = local_534.smallend.vect[2] * 2 + -1;
        for (lVar7 = (long)local_534.smallend.vect[2]; iVar5 = (int)lVar7,
            iVar5 <= local_534.bigend.vect[2]; lVar7 = lVar7 + 1) {
          iVar34 = iVar5 * 2;
          _kk = (double)CONCAT44(uStack_514,iVar34);
          lVar25 = (long)cfab.p +
                   (lVar33 - cfab.begin.y) * cfab.jstride * 8 +
                   (lVar7 - cfab.begin.z) * cfab.kstride * 8 + (long)cfab.begin.x * -8 + lVar8 * 8;
          piVar36 = local_458.p +
                    lVar8 * 2 +
                    (((lVar33 * 2 - (long)local_458.begin.y) * local_458.jstride +
                     ((long)iVar9 - (long)local_458.begin.z) * local_458.kstride) -
                    (long)local_458.begin.x);
          local_6d0 = lVar33 * 2;
          iVar28 = local_534.smallend.vect[1] * 2 + -1;
          iVar1 = local_534.smallend.vect[1] * 2 + 1;
          for (lVar38 = lVar33; lVar38 <= local_534.bigend.vect[1]; lVar38 = lVar38 + 1) {
            if (local_534.smallend.vect[0] <= local_534.bigend.vect[0]) {
              iVar14 = (int)(lVar38 * 2);
              lVar43 = (~local_498.begin.y + iVar14) * local_498.jstride;
              lVar13 = (~local_498.begin.z + iVar34) * local_498.kstride;
              lVar23 = ((iVar14 + 1) - local_498.begin.y) * local_498.jstride;
              lVar15 = ((iVar5 * 2 + 1) - local_498.begin.z) * local_498.kstride;
              lVar19 = (lVar38 * 2 - (long)local_498.begin.y) * local_498.jstride;
              lVar29 = (iVar34 - local_498.begin.z) * local_498.kstride;
              lVar20 = local_498.jstride * 8;
              lVar35 = (local_6d0 - local_498.begin.y) * lVar20;
              lVar18 = local_498.kstride * 8;
              lVar40 = ((long)iVar9 - (long)local_498.begin.z) * lVar18;
              lVar37 = (iVar4 - local_498.begin.z) * lVar18;
              lVar18 = (iVar10 - local_498.begin.z) * lVar18;
              lVar26 = (iVar1 - local_498.begin.y) * lVar20;
              lVar20 = (iVar28 - local_498.begin.y) * lVar20;
              lVar12 = (long)local_498.begin.x;
              lVar27 = 0;
              iVar14 = (local_534.bigend.vect[0] - local_534.smallend.vect[0]) + 1;
              do {
                dVar56 = 0.0;
                if (piVar36[lVar27] == 0) {
                  lVar31 = (long)(((local_534.smallend.vect[0] * 2 + -1) - local_498.begin.x) +
                                 (int)lVar27);
                  lVar41 = (long)((local_534.smallend.vect[0] * 2 - local_498.begin.x) + 1 +
                                 (int)lVar27);
                  dVar56 = *(double *)
                            ((long)local_498.p +
                            lVar27 * 8 + lVar35 + lVar40 + lVar12 * -8 + lVar8 * 0x10) * 0.125 +
                           ((double)local_498.p[lVar19 + lVar31 + lVar29] +
                            (double)local_498.p[lVar19 + lVar41 + lVar29] +
                            *(double *)
                             ((long)local_498.p +
                             lVar27 * 8 + lVar40 + lVar20 + lVar12 * -8 + lVar8 * 0x10) +
                            *(double *)
                             ((long)local_498.p +
                             lVar27 * 8 + lVar40 + lVar26 + lVar12 * -8 + lVar8 * 0x10) +
                            *(double *)
                             ((long)local_498.p +
                             lVar27 * 8 + lVar35 + lVar18 + lVar12 * -8 + lVar8 * 0x10) +
                           *(double *)
                            ((long)local_498.p +
                            lVar27 * 8 + lVar35 + lVar37 + lVar12 * -8 + lVar8 * 0x10)) * 0.0625 +
                           ((double)local_498.p[lVar43 + lVar31 + lVar13] +
                            (double)local_498.p[lVar43 + lVar41 + lVar13] +
                            (double)local_498.p[lVar23 + lVar31 + lVar13] +
                            (double)local_498.p[lVar23 + lVar41 + lVar13] +
                            (double)local_498.p[lVar43 + lVar31 + lVar15] +
                            (double)local_498.p[lVar43 + lVar41 + lVar15] +
                            (double)local_498.p[lVar23 + lVar31 + lVar15] +
                           (double)local_498.p[lVar23 + lVar41 + lVar15]) * 0.015625 +
                           (*(double *)
                             ((long)local_498.p +
                             lVar27 * 8 + lVar20 + lVar18 + lVar12 * -8 + lVar8 * 0x10) +
                            *(double *)
                             ((long)local_498.p +
                             lVar27 * 8 + lVar26 + lVar18 + lVar12 * -8 + lVar8 * 0x10) +
                            *(double *)
                             ((long)local_498.p +
                             lVar27 * 8 + lVar37 + lVar20 + lVar12 * -8 + lVar8 * 0x10) +
                            *(double *)
                             ((long)local_498.p +
                             lVar27 * 8 + lVar37 + lVar26 + lVar12 * -8 + lVar8 * 0x10) +
                            (double)local_498.p[lVar19 + lVar31 + lVar13] +
                            (double)local_498.p[lVar19 + lVar41 + lVar13] +
                            (double)local_498.p[lVar19 + lVar31 + lVar15] +
                            (double)local_498.p[lVar19 + lVar41 + lVar15] +
                            (double)local_498.p[lVar43 + lVar31 + lVar29] +
                            (double)local_498.p[lVar43 + lVar41 + lVar29] +
                            (double)local_498.p[lVar23 + lVar31 + lVar29] +
                           (double)local_498.p[lVar23 + lVar41 + lVar29]) * 0.03125;
                }
                *(double *)(lVar25 + lVar27 * 4) = dVar56;
                lVar27 = lVar27 + 2;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            lVar25 = lVar25 + cfab.jstride * 8;
            local_6d0 = local_6d0 + 2;
            iVar1 = iVar1 + 2;
            iVar28 = iVar28 + 2;
            piVar36 = piVar36 + local_458.jstride * 2;
          }
          iVar9 = iVar9 + 2;
          iVar4 = iVar4 + 2;
          iVar10 = iVar10 + 2;
        }
      }
      else {
        iVar4 = local_534.smallend.vect[0] * 2;
        for (iVar10 = local_534.smallend.vect[2]; iVar10 <= local_534.bigend.vect[2];
            iVar10 = iVar10 + 1) {
          lVar8 = (long)iVar10;
          iVar5 = (int)(lVar8 * 2);
          for (iVar9 = local_534.smallend.vect[1]; iVar9 <= local_534.bigend.vect[1];
              iVar9 = iVar9 + 1) {
            if (local_534.smallend.vect[0] <= local_534.bigend.vect[0]) {
              lVar12 = (long)iVar9;
              iVar1 = (int)(lVar12 * 2);
              lVar33 = (long)local_458.begin.y;
              lVar20 = (long)local_458.begin.z;
              lVar19 = (~local_498.begin.y + iVar1) * local_498.jstride;
              lVar13 = (iVar1 - local_498.begin.y) * local_498.jstride;
              lVar25 = ((iVar1 + 1) - local_498.begin.y) * local_498.jstride;
              lVar18 = (lVar12 - local_498.begin.y) * local_498.jstride;
              lVar43 = (~local_498.begin.z + iVar5) * local_498.kstride;
              lVar7 = (iVar5 - local_498.begin.z) * local_498.kstride;
              lVar38 = ((iVar5 + 1) - local_498.begin.z) * local_498.kstride;
              lVar15 = (lVar8 - local_498.begin.z) * local_498.kstride;
              uVar6 = ~local_498.begin.x;
              iVar24 = local_534.smallend.vect[0] - local_498.begin.x;
              iVar21 = -local_498.begin.x;
              iVar17 = local_534.smallend.vect[0] - local_458.begin.x;
              iVar39 = -local_458.begin.x;
              iVar30 = local_534.smallend.vect[0] - cfab.begin.x;
              iVar28 = (local_534.bigend.vect[0] - local_534.smallend.vect[0]) + 1;
              iVar34 = iVar39;
              uVar42 = uVar6;
              iVar14 = iVar21;
              do {
                if (cVar11 == '\0') {
                  dVar56 = 0.0;
                  if (local_458.p
                      [(lVar12 * 2 - lVar33) * local_458.jstride +
                       (lVar8 * 2 - lVar20) * local_458.kstride + (long)iVar17] == 0) {
                    lVar23 = (long)iVar24;
                    dVar56 = local_498.p[lVar13 + lVar23 + lVar38] +
                             (double)local_498.p[lVar13 + lVar23 + lVar38] +
                             local_498.p[lVar25 + lVar23 + lVar7] +
                             (double)local_498.p[lVar25 + lVar23 + lVar7] +
                             (double)local_498.p[lVar13 + lVar23 + lVar7] * 4.0 +
                             local_498.p[lVar19 + lVar23 + lVar7] +
                             (double)local_498.p[lVar19 + lVar23 + lVar7] +
                             local_498.p[lVar13 + lVar23 + lVar43] +
                             (double)local_498.p[lVar13 + lVar23 + lVar43] +
                             (double)local_498.p[lVar19 + lVar23 + lVar43] +
                             (double)local_498.p[lVar25 + lVar23 + lVar43] +
                             (double)local_498.p[lVar19 + lVar23 + lVar38];
                    ppuVar16 = (undefined **)(local_498.p + lVar25 + lVar23 + lVar38);
                    goto LAB_00604276;
                  }
                }
                else if (cVar11 == '\x01') {
                  dVar56 = 0.0;
                  if (local_458.p
                      [(lVar12 - lVar33) * local_458.jstride +
                       (iVar5 - lVar20) * local_458.kstride + (long)(iVar4 + iVar39)] == 0) {
                    lVar23 = (long)(int)(iVar4 + uVar6);
                    lVar26 = (long)(iVar4 + iVar21);
                    lVar35 = (long)(iVar4 + 1 + iVar21);
                    dVar56 = local_498.p[lVar18 + lVar26 + lVar38] +
                             (double)local_498.p[lVar18 + lVar26 + lVar38] +
                             local_498.p[lVar18 + lVar35 + lVar7] +
                             (double)local_498.p[lVar18 + lVar35 + lVar7] +
                             (double)local_498.p[lVar18 + lVar26 + lVar7] * 4.0 +
                             local_498.p[lVar18 + lVar23 + lVar7] +
                             (double)local_498.p[lVar18 + lVar23 + lVar7] +
                             local_498.p[lVar18 + lVar26 + lVar43] +
                             (double)local_498.p[lVar18 + lVar26 + lVar43] +
                             (double)local_498.p[lVar18 + lVar23 + lVar43] +
                             (double)local_498.p[lVar18 + lVar35 + lVar43] +
                             (double)local_498.p[lVar18 + lVar23 + lVar38];
                    ppuVar16 = (undefined **)(local_498.p + lVar18 + lVar35 + lVar38);
LAB_00604276:
                    dVar56 = (dVar56 + (double)*ppuVar16) * 0.0625;
                  }
                }
                else {
                  dVar56 = 0.0;
                  if (local_458.p
                      [(iVar1 - lVar33) * local_458.jstride +
                       (lVar8 - lVar20) * local_458.kstride + (long)(iVar4 + iVar34)] == 0) {
                    lVar35 = (long)(int)(iVar4 + uVar42);
                    lVar23 = (long)(iVar4 + iVar14);
                    lVar26 = (long)(iVar4 + 1 + iVar14);
                    dVar56 = local_498.p[lVar25 + lVar15 + lVar23] +
                             (double)local_498.p[lVar25 + lVar15 + lVar23] +
                             local_498.p[lVar13 + lVar15 + lVar26] +
                             (double)local_498.p[lVar13 + lVar15 + lVar26] +
                             (double)local_498.p[lVar13 + lVar15 + lVar23] * 4.0 +
                             local_498.p[lVar13 + lVar15 + lVar35] +
                             (double)local_498.p[lVar13 + lVar15 + lVar35] +
                             local_498.p[lVar19 + lVar15 + lVar23] +
                             (double)local_498.p[lVar19 + lVar15 + lVar23] +
                             (double)local_498.p[lVar19 + lVar15 + lVar35] +
                             (double)local_498.p[lVar19 + lVar15 + lVar26] +
                             (double)local_498.p[lVar25 + lVar15 + lVar35];
                    ppuVar16 = (undefined **)(local_498.p + lVar25 + lVar15 + lVar26);
                    goto LAB_00604276;
                  }
                }
                cfab.p[(lVar12 - cfab.begin.y) * cfab.jstride +
                       (lVar8 - cfab.begin.z) * cfab.kstride + (long)iVar30] = dVar56;
                iVar14 = iVar14 + 2;
                uVar42 = uVar42 + 2;
                iVar34 = iVar34 + 2;
                iVar21 = iVar21 + 2;
                uVar6 = uVar6 + 2;
                iVar39 = iVar39 + 2;
                iVar24 = iVar24 + 1;
                iVar30 = iVar30 + 1;
                iVar17 = iVar17 + 1;
                iVar28 = iVar28 + -1;
              } while (iVar28 != 0);
            }
          }
        }
      }
    }
    else {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_1f0,*(FabArray<amrex::FArrayBox> **)(local_3a8 + lVar22 * 8),&mfi);
      local_500 = (long)local_534.smallend.vect[0];
      local_398 = (long)local_534.smallend.vect[1];
      local_358 = (ulong)(uint)local_534.bigend.vect[0];
      local_350 = (long)local_534.bigend.vect[1];
      for (iVar4 = local_534.smallend.vect[2]; iVar4 <= local_534.bigend.vect[2]; iVar4 = iVar4 + 1)
      {
        local_368 = (long)iVar4 * 2;
        iVar10 = (int)local_368;
        local_4e0 = (long)local_458.begin.x;
        local_378 = (long)local_458.begin.y;
        local_370 = local_458.p + (local_368 - local_458.begin.z) * local_458.kstride;
        local_4e8 = (long)cfab.begin.x;
        local_388 = (long)cfab.begin.y;
        local_390 = cfab.jstride;
        local_360 = cfab.p + ((long)iVar4 - (long)cfab.begin.z) * cfab.kstride;
        for (lVar8 = local_398; lVar8 <= local_350; lVar8 = lVar8 + 1) {
          if (local_534.smallend.vect[0] <= local_534.bigend.vect[0]) {
            lVar38 = lVar8 * 2;
            lVar33 = lVar8 * 2 + -1;
            lVar7 = lVar8 * 2 + 1;
            lVar25 = (long)local_498.begin.y;
            lVar12 = (lVar38 - lVar25) * local_498.jstride;
            lVar43 = (long)local_1f0.begin.y;
            lVar40 = (lVar38 - lVar43) * local_1f0.jstride;
            lVar15 = (((int)lVar38 - local_1f0.begin.y) + -2) * local_1f0.jstride;
            lVar35 = (lVar33 - lVar43) * local_1f0.jstride;
            lVar37 = (lVar7 - lVar43) * local_1f0.jstride;
            lVar23 = (lVar33 - lVar25) * local_498.jstride;
            local_320 = (undefined **)(local_498.p + (lVar7 - lVar25) * local_498.jstride);
            lVar13 = (iVar10 - local_1f0.begin.z) * local_1f0.kstride;
            lVar18 = ((iVar10 + -2) - local_1f0.begin.z) * local_1f0.kstride;
            lVar19 = ((iVar10 + -1) - local_1f0.begin.z) * local_1f0.kstride;
            lVar20 = ((iVar10 + 1) - local_1f0.begin.z) * local_1f0.kstride;
            lVar26 = (iVar10 - local_498.begin.z) * local_498.kstride;
            lVar25 = ((iVar10 + -1) - local_498.begin.z) * local_498.kstride;
            lVar43 = ((iVar10 + 1) - local_498.begin.z) * local_498.kstride;
            local_328 = local_370 + (lVar38 - local_378) * local_458.jstride;
            local_330 = local_360 + (lVar8 - local_388) * cfab.jstride;
            lVar7 = (long)local_498.begin.x;
            local_338 = (long)local_1f0.begin.x;
            local_4f0 = (undefined **)(local_498.p + lVar23 + lVar26);
            local_4f8 = local_320 + lVar26;
            local_348 = local_1f0.nstride * 7;
            local_340 = local_1f0.nstride * 8;
            lVar33 = local_500;
            do {
              uVar44 = lVar33 * 2;
              dVar56 = 0.0;
              if (local_328[uVar44 - local_4e0] == 0) {
                lVar27 = uVar44 - lVar7;
                lVar29 = (long)(((int)uVar44 - local_1f0.begin.x) + -2);
                lVar38 = uVar44 - 1;
                lVar41 = lVar38 - local_338;
                dVar56 = local_1f0.p[lVar40 + lVar41 + lVar13 + local_1f0.nstride];
                if (((local_1f0.p[lVar40 + lVar29 + lVar13 + local_1f0.nstride] != 0.0) ||
                    (dVar56 != 0.0)) || (NAN(dVar56))) {
                  dVar56 = ((double)local_498.p[lVar12 + lVar26 + (lVar38 - lVar7)] * ABS(dVar56)) /
                           (ABS(local_1f0.p[lVar40 + lVar29 + lVar13 + local_1f0.nstride]) +
                           ABS(dVar56));
                }
                else {
                  dVar56 = (double)local_498.p[lVar12 + lVar26 + (lVar38 - lVar7)] * 0.5;
                }
                lVar31 = uVar44 - local_338;
                uVar44 = uVar44 | 1;
                dVar57 = local_1f0.p[lVar40 + lVar31 + lVar13 + local_1f0.nstride];
                dVar58 = (local_1f0.p + lVar40 + lVar31 + lVar13 + local_1f0.nstride)[1];
                if (((dVar57 != 0.0) || (NAN(dVar57))) || ((dVar58 != 0.0 || (NAN(dVar58))))) {
                  dVar57 = ((double)local_498.p[lVar12 + lVar26 + (uVar44 - lVar7)] * ABS(dVar57)) /
                           (ABS(dVar58) + ABS(dVar57));
                }
                else {
                  dVar57 = (double)local_498.p[lVar12 + lVar26 + (uVar44 - lVar7)] * 0.5;
                }
                local_2d8 = local_1f0.p + lVar15 + lVar31;
                dVar58 = local_2d8[lVar13 + local_1f0.nstride * 2];
                dVar59 = local_1f0.p[lVar35 + lVar31 + lVar13 + local_1f0.nstride * 2];
                if (((dVar58 != 0.0) || (NAN(dVar58))) || ((dVar59 != 0.0 || (NAN(dVar59))))) {
                  dVar58 = ((double)local_4f0[lVar27] * ABS(dVar59)) / (ABS(dVar58) + ABS(dVar59));
                }
                else {
                  dVar58 = (double)local_4f0[lVar27] * 0.5;
                }
                dVar59 = local_1f0.p[lVar40 + lVar31 + lVar13 + local_1f0.nstride * 2];
                local_2f0 = local_1f0.p + lVar37 + lVar31;
                dVar60 = local_2f0[lVar13 + local_1f0.nstride * 2];
                if ((((dVar59 != 0.0) || (NAN(dVar59))) || (dVar60 != 0.0)) || (NAN(dVar60))) {
                  dVar59 = ((double)local_4f8[lVar27] * ABS(dVar59)) / (ABS(dVar59) + ABS(dVar60));
                }
                else {
                  dVar59 = (double)local_4f8[lVar27] * 0.5;
                }
                dVar60 = local_1f0.p[lVar40 + lVar31 + lVar18 + local_1f0.nstride * 3];
                dVar61 = local_1f0.p[lVar40 + lVar31 + lVar19 + local_1f0.nstride * 3];
                if (((dVar60 != 0.0) || (NAN(dVar60))) || ((dVar61 != 0.0 || (NAN(dVar61))))) {
                  dVar60 = ((double)local_498.p[lVar12 + lVar27 + lVar25] * ABS(dVar61)) /
                           (ABS(dVar60) + ABS(dVar61));
                }
                else {
                  dVar60 = (double)local_498.p[lVar12 + lVar27 + lVar25] * 0.5;
                }
                lVar32 = uVar44 - local_338;
                dVar61 = local_1f0.p[lVar40 + lVar31 + lVar13 + local_1f0.nstride * 3];
                local_2e8 = local_1f0.p + lVar40 + lVar31 + lVar20;
                dVar47 = local_2e8[local_1f0.nstride * 3];
                if (((dVar61 != 0.0) || (NAN(dVar61))) || ((dVar47 != 0.0 || (NAN(dVar47))))) {
                  dVar61 = ((double)local_498.p[lVar12 + lVar27 + lVar43] * ABS(dVar61)) /
                           (ABS(dVar61) + ABS(dVar47));
                }
                else {
                  dVar61 = (double)local_498.p[lVar12 + lVar27 + lVar43] * 0.5;
                }
                local_298 = local_1f0.p + lVar35 + lVar29 + lVar13;
                local_288 = local_1f0.p + lVar15 + lVar29 + lVar13;
                dVar94 = ABS(local_288[local_1f0.nstride * 4]);
                dVar62 = ABS(local_298[local_1f0.nstride * 4]);
                local_2a0 = local_1f0.p + lVar35 + lVar41 + lVar13;
                local_290 = local_1f0.p + lVar15 + lVar41 + lVar13;
                dVar118 = ABS(local_290[local_1f0.nstride * 4]);
                dVar102 = ABS(local_2a0[local_1f0.nstride * 4]);
                dVar130 = ABS(local_290[local_1f0.nstride * 2]) / (dVar94 + dVar118 + 1e-100);
                dVar139 = ABS(local_2a0[local_1f0.nstride * 2]) / (dVar62 + dVar102 + 1e-100);
                dVar70 = ABS(local_298[local_1f0.nstride]) / (dVar94 + dVar62 + 1e-100) + 1.0;
                dVar88 = ABS(local_2a0[local_1f0.nstride]) / (dVar118 + dVar102 + 1e-100) + 1.0;
                dVar102 = (dVar88 + dVar139) * dVar102;
                lVar38 = lVar38 - lVar7;
                dVar95 = ABS(local_2d8[lVar13 + local_1f0.nstride * 4]);
                dVar47 = ABS(local_1f0.p[lVar35 + lVar31 + lVar13 + local_1f0.nstride * 4]);
                local_2d0 = local_1f0.p + lVar35 + lVar32 + lVar13;
                local_268 = local_1f0.p + lVar15 + lVar32;
                local_2c8 = local_268 + lVar13;
                dVar131 = ABS(local_2c8[local_1f0.nstride * 4]);
                dVar103 = ABS(local_2d0[local_1f0.nstride * 4]);
                dVar119 = ABS(local_2c8[local_1f0.nstride * 2]) / (dVar95 + dVar131 + 1e-100);
                dVar140 = ABS(local_2d0[local_1f0.nstride * 2]) / (dVar47 + dVar103 + 1e-100);
                dVar71 = ABS(local_1f0.p[lVar35 + lVar31 + lVar13 + local_1f0.nstride]) /
                         (dVar95 + dVar47 + 1e-100) + 1.0;
                dVar89 = ABS(local_2d0[local_1f0.nstride]) / (dVar131 + dVar103 + 1e-100) + 1.0;
                dVar47 = (dVar71 + dVar140) * dVar47;
                lVar45 = uVar44 - lVar7;
                local_260 = (undefined **)(local_498.p + lVar23 + lVar45);
                local_278 = local_1f0.p + lVar37 + lVar29;
                local_300 = local_278 + lVar13;
                dVar104 = ABS(local_1f0.p[lVar40 + lVar29 + lVar13 + local_1f0.nstride * 4]);
                dVar96 = ABS(local_300[local_1f0.nstride * 4]);
                local_2e0 = local_1f0.p + lVar37 + lVar41;
                local_2f8 = local_2e0 + lVar13;
                dVar132 = ABS(local_1f0.p[lVar40 + lVar41 + lVar13 + local_1f0.nstride * 4]);
                dVar120 = ABS(local_2f8[local_1f0.nstride * 4]);
                dVar63 = ABS(local_1f0.p[lVar40 + lVar41 + lVar13 + local_1f0.nstride * 2]) /
                         (dVar104 + dVar132 + 1e-100);
                dVar141 = ABS(local_2f8[local_1f0.nstride * 2]) / (dVar96 + dVar120 + 1e-100);
                dVar72 = ABS(local_300[local_1f0.nstride]) / (dVar104 + dVar96 + 1e-100) + 1.0;
                dVar90 = ABS(local_2f8[local_1f0.nstride]) / (dVar132 + dVar120 + 1e-100) + 1.0;
                dVar132 = (dVar63 + dVar90) * dVar132;
                dVar48 = ABS(local_2f0[lVar13 + local_1f0.nstride * 4]);
                dVar105 = ABS(local_1f0.p[lVar40 + lVar31 + lVar13 + local_1f0.nstride * 4]);
                local_280 = local_1f0.p + lVar37 + lVar32;
                local_308 = local_280 + lVar13;
                dVar121 = ABS(local_308[local_1f0.nstride * 4]);
                dVar133 = ABS(local_1f0.p[lVar40 + lVar32 + lVar13 + local_1f0.nstride * 4]);
                dVar97 = ABS(local_1f0.p[lVar40 + lVar32 + lVar13 + local_1f0.nstride * 2]) /
                         (dVar105 + dVar133 + 1e-100);
                dVar142 = ABS(local_308[local_1f0.nstride * 2]) / (dVar48 + dVar121 + 1e-100);
                dVar73 = ABS(local_2f0[lVar13 + local_1f0.nstride]) / (dVar48 + dVar105 + 1e-100) +
                         1.0;
                dVar105 = (dVar73 + dVar97) * dVar105;
                dVar91 = ABS(local_308[local_1f0.nstride]) / (dVar121 + dVar133 + 1e-100) + 1.0;
                local_270 = local_320 + lVar45;
                local_2b8 = local_1f0.p + lVar40 + lVar29 + lVar19;
                local_2a8 = local_1f0.p + lVar40 + lVar29 + lVar18;
                dVar64 = ABS(local_2a8[local_1f0.nstride * 5]);
                dVar74 = ABS(local_2b8[local_1f0.nstride * 5]);
                uStack_3d0 = 0;
                local_2b0 = local_1f0.p + lVar40 + lVar41 + lVar19;
                local_2c0 = local_1f0.p + lVar40 + lVar41 + lVar18;
                dVar185 = ABS(local_2c0[local_1f0.nstride * 5]);
                dVar175 = ABS(local_2b0[local_1f0.nstride * 5]);
                dVar193 = ABS(local_2c0[local_1f0.nstride * 3]) / (dVar64 + dVar185 + 1e-100);
                dVar198 = ABS(local_2b0[local_1f0.nstride * 3]) / (dVar74 + dVar175 + 1e-100);
                dVar92 = ABS(local_2b8[local_1f0.nstride]) / (dVar64 + dVar74 + 1e-100) + 1.0;
                local_310 = local_1f0.p + lVar40 + lVar29 + lVar20;
                dVar49 = ABS(local_310[local_1f0.nstride * 5]);
                uStack_3e0 = 0;
                dVar159 = ABS(local_1f0.p[lVar40 + lVar29 + lVar13 + local_1f0.nstride * 5]);
                local_318 = local_1f0.p + lVar40 + lVar41 + lVar20;
                dVar65 = ABS(local_318[local_1f0.nstride * 5]);
                uStack_3f0 = 0;
                dVar50 = ABS(local_1f0.p[lVar40 + lVar41 + lVar13 + local_1f0.nstride * 5]);
                dVar66 = ABS(local_1f0.p[lVar40 + lVar41 + lVar13 + local_1f0.nstride * 3]) /
                         (dVar159 + dVar50 + 1e-100);
                dVar98 = ABS(local_310[local_1f0.nstride]) / (dVar49 + dVar159 + 1e-100) + 1.0;
                dVar75 = ABS(local_318[local_1f0.nstride]) / (dVar65 + dVar50 + 1e-100) + 1.0;
                uStack_410 = 0;
                dVar50 = (dVar66 + dVar75) * dVar50;
                dVar152 = ABS(local_2b0[local_1f0.nstride]) / (dVar185 + dVar175 + 1e-100) + 1.0;
                dVar175 = (dVar152 + dVar198) * dVar175;
                dVar106 = ABS(local_1f0.p[lVar40 + lVar31 + lVar18 + local_1f0.nstride * 5]);
                dVar51 = ABS(local_1f0.p[lVar40 + lVar31 + lVar19 + local_1f0.nstride * 5]);
                local_3d8 = local_1f0.p + lVar40 + lVar32 + lVar18;
                dVar153 = ABS(local_3d8[local_1f0.nstride * 5]);
                dVar76 = ABS(local_1f0.p[lVar40 + lVar32 + lVar19 + local_1f0.nstride * 5]);
                uStack_400 = 0;
                dVar199 = ABS(local_3d8[local_1f0.nstride * 3]) / (dVar106 + dVar153 + 1e-100);
                dVar77 = ABS(local_1f0.p[lVar40 + lVar32 + lVar19 + local_1f0.nstride * 3]) /
                         (dVar51 + dVar76 + 1e-100);
                dVar176 = ABS(local_1f0.p[lVar40 + lVar31 + lVar19 + local_1f0.nstride]) /
                          (dVar106 + dVar51 + 1e-100) + 1.0;
                dVar186 = ABS(local_1f0.p[lVar40 + lVar32 + lVar19 + local_1f0.nstride]) /
                          (dVar153 + dVar76 + 1e-100) + 1.0;
                dVar51 = (dVar176 + dVar77) * dVar51;
                dVar107 = ABS(local_318[local_1f0.nstride * 3]) / (dVar49 + dVar65 + 1e-100);
                dVar99 = ABS(local_2e8[local_1f0.nstride * 5]);
                dVar52 = ABS(local_1f0.p[lVar40 + lVar31 + lVar13 + local_1f0.nstride * 5]);
                dVar122 = ABS(local_1f0.p[lVar40 + lVar32 + lVar20 + local_1f0.nstride * 5]);
                dVar143 = ABS(local_1f0.p[lVar40 + lVar32 + lVar13 + local_1f0.nstride * 5]);
                dVar160 = ABS(local_1f0.p[lVar40 + lVar32 + lVar13 + local_1f0.nstride * 3]) /
                          (dVar52 + dVar143 + 1e-100);
                dVar177 = ABS(local_1f0.p[lVar40 + lVar32 + lVar20 + local_1f0.nstride * 3]) /
                          (dVar99 + dVar122 + 1e-100);
                dVar78 = ABS(local_2e8[local_1f0.nstride]) / (dVar99 + dVar52 + 1e-100) + 1.0;
                dVar52 = (dVar78 + dVar160) * dVar52;
                dVar108 = ABS(local_1f0.p[lVar40 + lVar32 + lVar20 + local_1f0.nstride]) /
                          (dVar122 + dVar143 + 1e-100) + 1.0;
                local_3e8 = local_2d8 + lVar19;
                dVar161 = ABS(local_3e8[local_1f0.nstride * 6]);
                local_408 = local_2f0 + lVar19;
                dVar79 = ABS(local_408[local_1f0.nstride * 6]);
                dVar109 = ABS(local_2d8[lVar18 + local_1f0.nstride * 6]);
                dVar117 = ABS(local_1f0.p[lVar40 + lVar31 + lVar18 + local_1f0.nstride * 6]);
                dVar53 = ABS(local_3e8[local_1f0.nstride * 2]) / (dVar109 + dVar161 + 1e-100) + 1.0;
                dVar123 = ABS(local_1f0.p[lVar35 + lVar31 + lVar19 + local_1f0.nstride * 6]);
                dVar129 = ABS(local_1f0.p[lVar40 + lVar31 + lVar19 + local_1f0.nstride * 6]);
                auVar168._0_8_ = ABS(local_1f0.p[lVar35 + lVar31 + lVar19 + local_1f0.nstride * 3]);
                auVar168._8_8_ = ABS(local_408[local_1f0.nstride * 3]);
                auVar180._0_8_ = dVar123 + dVar161 + 1e-100;
                auVar180._8_8_ = dVar79 + dVar129 + 1e-100;
                auVar100 = divpd(auVar168,auVar180);
                auVar163._0_8_ = ABS(local_1f0.p[lVar35 + lVar31 + lVar19 + local_1f0.nstride * 2]);
                auVar163._8_8_ = ABS(local_1f0.p[lVar40 + lVar31 + lVar19 + local_1f0.nstride * 2]);
                local_3f8 = local_1f0.p + lVar35 + lVar31 + lVar18;
                local_418 = local_2f0 + lVar18;
                dVar178 = ABS(local_3f8[local_1f0.nstride * 6]);
                dVar184 = ABS(local_418[local_1f0.nstride * 6]);
                auVar194._0_8_ = dVar178 + dVar123 + 1e-100;
                auVar194._8_8_ = dVar129 + dVar117 + 1e-100;
                auVar164 = divpd(auVar163,auVar194);
                auVar187._0_8_ = ABS(local_3f8[local_1f0.nstride * 3]);
                auVar187._8_8_ = ABS(local_418[local_1f0.nstride * 3]);
                auVar195._0_8_ = dVar109 + dVar178 + 1e-100;
                auVar195._8_8_ = dVar117 + dVar184 + 1e-100;
                auVar188 = divpd(auVar187,auVar195);
                dVar162 = auVar164._0_8_ + 1.0;
                dVar174 = auVar164._8_8_ + 1.0;
                dVar67 = ABS(local_408[local_1f0.nstride * 2]) / (dVar184 + dVar79 + 1e-100) + 1.0;
                dVar123 = (auVar100._0_8_ + dVar162) * dVar123;
                dVar129 = (auVar100._8_8_ + dVar174) * dVar129;
                auVar164._0_8_ = (double)local_498.p[lVar23 + lVar27 + lVar25] * dVar123;
                auVar164._8_8_ = (double)local_320[lVar27 + lVar25] * dVar129;
                auVar170._0_8_ =
                     dVar123 + (dVar53 + auVar100._0_8_) * dVar161 +
                               (dVar162 + auVar188._0_8_) * dVar178 +
                               (dVar53 + auVar188._0_8_) * dVar109 + 1e-100;
                auVar170._8_8_ =
                     (auVar100._8_8_ + dVar67) * dVar79 +
                     dVar129 + (dVar67 + auVar188._8_8_) * dVar184 +
                               (dVar174 + auVar188._8_8_) * dVar117 + 1e-100;
                auVar164 = divpd(auVar164,auVar170);
                dVar53 = ABS(local_2d8[lVar13 + local_1f0.nstride * 6]);
                dVar117 = ABS(local_2f0[lVar13 + local_1f0.nstride * 6]);
                dVar109 = ABS(local_2d8[lVar20 + local_1f0.nstride * 6]);
                dVar123 = ABS(local_2e8[local_1f0.nstride * 6]);
                dVar184 = ABS(local_2d8[lVar20 + local_1f0.nstride * 2]) /
                          (dVar109 + dVar53 + 1e-100) + 1.0;
                dVar67 = ABS(local_1f0.p[lVar35 + lVar31 + lVar13 + local_1f0.nstride * 6]);
                dVar79 = ABS(local_1f0.p[lVar40 + lVar31 + lVar13 + local_1f0.nstride * 6]);
                auVar165._0_8_ = ABS(local_1f0.p[lVar35 + lVar31 + lVar13 + local_1f0.nstride * 3]);
                auVar165._8_8_ = ABS(local_2f0[lVar13 + local_1f0.nstride * 3]);
                auVar190._0_8_ = dVar67 + dVar53 + 1e-100;
                auVar190._8_8_ = dVar117 + dVar79 + 1e-100;
                auVar166 = divpd(auVar165,auVar190);
                auVar127._0_8_ = ABS(local_1f0.p[lVar35 + lVar31 + lVar20 + local_1f0.nstride * 2]);
                auVar127._8_8_ = ABS(local_2e8[local_1f0.nstride * 2]);
                dVar162 = ABS(local_1f0.p[lVar35 + lVar31 + lVar20 + local_1f0.nstride * 6]);
                dVar174 = ABS(local_2f0[lVar20 + local_1f0.nstride * 6]);
                auVar93._0_8_ = dVar162 + dVar67 + 1e-100;
                auVar93._8_8_ = dVar79 + dVar123 + 1e-100;
                auVar188 = divpd(auVar127,auVar93);
                local_3c8 = local_2f0[lVar20 + local_1f0.nstride * 7];
                uStack_3c0 = 0;
                auVar114._0_8_ = ABS(local_1f0.p[lVar35 + lVar31 + lVar20 + local_1f0.nstride * 3]);
                auVar114._8_8_ = ABS(local_2f0[lVar20 + local_1f0.nstride * 3]);
                auVar181._0_8_ = dVar109 + dVar162 + 1e-100;
                auVar181._8_8_ = dVar174 + dVar123 + 1e-100;
                auVar100 = divpd(auVar114,auVar181);
                dVar129 = auVar188._0_8_ + 1.0;
                dVar161 = auVar188._8_8_ + 1.0;
                dVar67 = (auVar166._0_8_ + dVar129) * dVar67;
                dVar79 = (auVar166._8_8_ + dVar161) * dVar79;
                dVar178 = ABS(local_2f0[lVar20 + local_1f0.nstride * 2]) /
                          (dVar174 + dVar117 + 1e-100) + 1.0;
                _kk = local_300[local_1f0.nstride * 7];
                uStack_510 = 0;
                auVar188._0_8_ =
                     dVar67 + (dVar184 + auVar166._0_8_) * dVar53 +
                     (dVar184 + auVar100._0_8_) * dVar109 + (dVar129 + auVar100._0_8_) * dVar162 +
                     1e-100;
                auVar188._8_8_ =
                     (auVar166._8_8_ + dVar178) * dVar117 + dVar79 +
                     (dVar161 + auVar100._8_8_) * dVar123 + (dVar178 + auVar100._8_8_) * dVar174 +
                     1e-100;
                auVar155._8_8_ = (double)local_320[lVar27 + lVar43] * dVar79;
                auVar155._0_8_ = (double)local_498.p[lVar23 + lVar27 + lVar43] * dVar67;
                auVar93 = divpd(auVar155,auVar188);
                dVar161 = ABS(local_1f0.p[lVar40 + lVar31 + lVar13 + local_1f0.nstride * 7]);
                dVar144 = ABS(local_2e8[local_1f0.nstride * 7]);
                auVar166._8_4_ = SUB84(dVar161,0);
                auVar166._0_8_ = dVar161;
                auVar166._12_4_ = (int)((ulong)dVar161 >> 0x20);
                dVar53 = dVar161 + ABS(local_1f0.p[lVar40 + lVar32 + lVar13 + local_1f0.nstride * 7]
                                      );
                dVar79 = auVar166._8_8_ + ABS(local_2f0[lVar13 + local_1f0.nstride * 7]);
                auVar167._0_8_ = ABS(local_1f0.p[lVar40 + lVar32 + lVar13 + local_1f0.nstride * 6]);
                auVar167._8_8_ = ABS(local_2f0[lVar13 + local_1f0.nstride * 5]);
                auVar69._0_8_ = dVar53 + 1e-100;
                auVar69._8_8_ = dVar79 + 1e-100;
                auVar168 = divpd(auVar167,auVar69);
                dVar184 = ABS(local_1f0.p[lVar40 + lVar41 + lVar13 + local_1f0.nstride * 7]);
                dVar162 = ABS(local_318[local_1f0.nstride * 7]);
                auVar136._8_4_ = SUB84(dVar184,0);
                auVar136._0_8_ = dVar184;
                auVar136._12_4_ = (int)((ulong)dVar184 >> 0x20);
                dVar109 = dVar184 + ABS(local_1f0.p
                                        [lVar40 + lVar29 + lVar13 + local_1f0.nstride * 7]);
                dVar123 = auVar136._8_8_ + ABS(local_2f8[local_1f0.nstride * 7]);
                auVar154._0_8_ = ABS(local_1f0.p[lVar40 + lVar41 + lVar13 + local_1f0.nstride * 6]);
                auVar154._8_8_ = ABS(local_2f8[local_1f0.nstride * 5]);
                auVar138._0_8_ = dVar109 + 1e-100;
                auVar138._8_8_ = dVar123 + 1e-100;
                auVar155 = divpd(auVar154,auVar138);
                dVar179 = ABS(local_1f0.p[lVar35 + lVar31 + lVar13 + local_1f0.nstride * 7]);
                dVar145 = ABS(local_1f0.p[lVar35 + lVar31 + lVar20 + local_1f0.nstride * 7]);
                dVar174 = ABS(local_2d0[local_1f0.nstride * 7]) + dVar179;
                dVar178 = dVar179 + ABS(local_2d8[lVar13 + local_1f0.nstride * 7]);
                auVar135._0_8_ = ABS(local_1f0.p[lVar35 + lVar31 + lVar20 + local_1f0.nstride * 4]);
                auVar135._8_8_ = ABS(local_2d0[local_1f0.nstride * 3]);
                auVar111._0_8_ = dVar179 + dVar145 + 1e-100;
                auVar111._8_8_ =
                     ABS(local_2d8[lVar13 + local_1f0.nstride * 7]) +
                     ABS(local_2c8[local_1f0.nstride * 7]) + dVar179 +
                     ABS(local_2d0[local_1f0.nstride * 7]) + 1e-100;
                auVar136 = divpd(auVar135,auVar111);
                auVar169._0_8_ = ABS(local_2d0[local_1f0.nstride * 6]);
                auVar169._8_8_ = ABS(local_1f0.p[lVar35 + lVar31 + lVar13 + local_1f0.nstride * 5]);
                auVar157._0_8_ = dVar174 + 1e-100;
                auVar157._8_8_ = dVar178 + 1e-100;
                auVar170 = divpd(auVar169,auVar157);
                dVar117 = ABS(local_2a0[local_1f0.nstride * 7]);
                dVar200 = ABS(local_298[local_1f0.nstride * 7]) + dVar117;
                dVar201 = dVar117 + ABS(local_290[local_1f0.nstride * 7]);
                dVar110 = ABS(local_1f0.p[lVar35 + lVar41 + lVar20 + local_1f0.nstride * 7]);
                auVar85._8_4_ = SUB84(dVar117,0);
                auVar85._0_8_ = dVar117;
                auVar85._12_4_ = (int)((ulong)dVar117 >> 0x20);
                auVar189._0_8_ = ABS(local_1f0.p[lVar35 + lVar41 + lVar20 + local_1f0.nstride * 4]);
                auVar189._8_8_ = ABS(local_2a0[local_1f0.nstride * 3]);
                auVar112._0_8_ = dVar110 + dVar117 + 1e-100;
                auVar112._8_8_ =
                     ABS(local_290[local_1f0.nstride * 7]) + ABS(local_288[local_1f0.nstride * 7]) +
                     ABS(local_298[local_1f0.nstride * 7]) + auVar85._8_8_ + 1e-100;
                auVar190 = divpd(auVar189,auVar112);
                auVar156._0_8_ = ABS(local_2a0[local_1f0.nstride * 6]);
                auVar156._8_8_ = ABS(local_2a0[local_1f0.nstride * 5]);
                auVar100._8_8_ = dVar201 + 1e-100;
                auVar100._0_8_ = dVar200 + 1e-100;
                auVar157 = divpd(auVar156,auVar100);
                dVar146 = ABS(local_1f0.p[lVar40 + lVar31 + lVar18 + local_1f0.nstride * 7]);
                dVar67 = ABS(local_408[local_1f0.nstride * 7]);
                dVar124 = ABS(local_1f0.p[lVar40 + lVar31 + lVar19 + local_1f0.nstride * 7]);
                auVar87._0_8_ = ABS(local_1f0.p[lVar40 + lVar32 + lVar19 + local_1f0.nstride * 2]);
                auVar87._8_8_ = ABS(local_408[local_1f0.nstride]);
                auVar191._8_4_ = SUB84(dVar146,0);
                auVar191._0_8_ = dVar146;
                auVar191._12_4_ = (int)((ulong)dVar146 >> 0x20);
                auVar80._8_4_ = SUB84(dVar124,0);
                auVar80._0_8_ = dVar124;
                auVar80._12_4_ = (int)((ulong)dVar124 >> 0x20);
                auVar192._0_8_ =
                     dVar146 + ABS(local_3d8[local_1f0.nstride * 7]) + dVar124 +
                     ABS(local_1f0.p[lVar40 + lVar32 + lVar19 + local_1f0.nstride * 7]) + 1e-100;
                auVar192._8_8_ =
                     auVar191._8_8_ + ABS(local_418[local_1f0.nstride * 7]) + auVar80._8_8_ + dVar67
                     + 1e-100;
                auVar100 = divpd(auVar87,auVar192);
                auVar137._0_8_ = ABS(local_1f0.p[lVar40 + lVar31 + lVar19 + local_1f0.nstride * 4]);
                auVar137._8_8_ = ABS(local_280[lVar19 + local_1f0.nstride * 3]);
                dVar129 = dVar124 + ABS(local_1f0.p
                                        [lVar40 + lVar32 + lVar19 + local_1f0.nstride * 7]);
                auVar147._0_8_ = dVar146 + dVar124 + 1e-100;
                auVar147._8_8_ =
                     dVar67 + dVar129 + ABS(local_280[lVar19 + local_1f0.nstride * 7]) + 1e-100;
                auVar138 = divpd(auVar137,auVar147);
                auVar113._0_8_ = ABS(local_1f0.p[lVar40 + lVar32 + lVar19 + local_1f0.nstride * 6]);
                auVar113._8_8_ = ABS(local_408[local_1f0.nstride * 5]);
                auVar81._0_8_ = dVar129 + 1e-100;
                auVar81._8_8_ = auVar80._8_8_ + dVar67 + 1e-100;
                auVar114 = divpd(auVar113,auVar81);
                dVar146 = ABS(local_2c0[local_1f0.nstride * 7]);
                dVar134 = ABS(local_2b0[local_1f0.nstride * 7]);
                dVar129 = ABS(local_2e0[lVar19 + local_1f0.nstride * 7]);
                auVar149._8_4_ = SUB84(dVar146,0);
                auVar149._0_8_ = dVar146;
                auVar149._12_4_ = (int)((ulong)dVar146 >> 0x20);
                auVar197._0_8_ = ABS(local_2e0[lVar19 + local_1f0.nstride]);
                auVar197._8_8_ = ABS(local_2b0[local_1f0.nstride * 2]);
                auVar173._0_8_ =
                     dVar129 + dVar134 + dVar146 + ABS(local_2e0[lVar18 + local_1f0.nstride * 7]) +
                     1e-100;
                auVar173._8_8_ =
                     dVar134 + ABS(local_2b8[local_1f0.nstride * 7]) +
                               auVar149._8_8_ + ABS(local_2a8[local_1f0.nstride * 7]) + 1e-100;
                auVar166 = divpd(auVar197,auVar173);
                auVar183._8_4_ = SUB84(dVar134,0);
                auVar183._0_8_ = dVar134;
                auVar183._12_4_ = (int)((ulong)dVar134 >> 0x20);
                dVar67 = dVar134 + ABS(local_2b8[local_1f0.nstride * 7]);
                auVar196._0_8_ = ABS(local_2b0[local_1f0.nstride * 4]);
                auVar196._8_8_ = ABS(local_2e0[lVar19 + local_1f0.nstride * 3]);
                auVar171._0_8_ = dVar134 + dVar146 + 1e-100;
                auVar171._8_8_ =
                     ABS(local_278[lVar19 + local_1f0.nstride * 7]) + dVar67 + dVar129 + 1e-100;
                auVar197 = divpd(auVar196,auVar171);
                auVar148._0_8_ = ABS(local_2b0[local_1f0.nstride * 6]);
                auVar148._8_8_ = ABS(local_2e0[lVar19 + local_1f0.nstride * 5]);
                auVar54._0_8_ = dVar67 + 1e-100;
                auVar54._8_8_ = auVar183._8_8_ + dVar129 + 1e-100;
                auVar149 = divpd(auVar148,auVar54);
                dVar125 = ABS(local_1f0.p[lVar35 + lVar31 + lVar19 + local_1f0.nstride * 7]);
                dVar146 = ABS(local_3e8[local_1f0.nstride * 7]);
                dVar67 = ABS(local_3f8[local_1f0.nstride * 7]);
                dVar129 = ABS(local_1f0.p[lVar35 + lVar32 + lVar19 + local_1f0.nstride * 7]);
                auVar150._8_4_ = SUB84(dVar67,0);
                auVar150._0_8_ = dVar67;
                auVar150._12_4_ = (int)((ulong)dVar67 >> 0x20);
                auVar172._0_8_ = ABS(local_1f0.p[lVar35 + lVar32 + lVar19 + local_1f0.nstride * 2]);
                auVar172._8_8_ = ABS(local_1f0.p[lVar35 + lVar31 + lVar19 + local_1f0.nstride]);
                auVar151._0_8_ =
                     dVar67 + ABS(local_1f0.p[lVar35 + lVar32 + lVar18 + local_1f0.nstride * 7]) +
                     dVar125 + dVar129 + 1e-100;
                auVar151._8_8_ =
                     auVar150._8_8_ + ABS(local_2d8[lVar18 + local_1f0.nstride * 7]) + dVar146 +
                     dVar125 + 1e-100;
                auVar173 = divpd(auVar172,auVar151);
                auVar68._0_8_ = ABS(local_1f0.p[lVar35 + lVar31 + lVar19 + local_1f0.nstride * 4]);
                auVar68._8_8_ = ABS(local_1f0.p[lVar35 + lVar32 + lVar19 + local_1f0.nstride * 3]);
                auVar158._0_8_ = dVar125 + dVar67 + 1e-100;
                auVar158._8_8_ =
                     dVar146 + ABS(local_268[lVar19 + local_1f0.nstride * 7]) + dVar125 + dVar129 +
                     1e-100;
                auVar69 = divpd(auVar68,auVar158);
                auVar182._0_8_ = ABS(local_1f0.p[lVar35 + lVar32 + lVar19 + local_1f0.nstride * 6]);
                auVar182._8_8_ = ABS(local_1f0.p[lVar35 + lVar31 + lVar19 + local_1f0.nstride * 5]);
                auVar115._0_8_ = dVar129 + dVar125 + 1e-100;
                auVar115._8_8_ = dVar125 + dVar146 + 1e-100;
                auVar183 = divpd(auVar182,auVar115);
                dVar126 = ABS(local_1f0.p[lVar35 + lVar41 + lVar18 + local_1f0.nstride * 7]);
                dVar146 = ABS(local_1f0.p[lVar35 + lVar29 + lVar19 + local_1f0.nstride * 7]);
                dVar67 = ABS(local_1f0.p[lVar35 + lVar41 + lVar19 + local_1f0.nstride * 7]);
                dVar129 = ABS(local_1f0.p[lVar15 + lVar41 + lVar19 + local_1f0.nstride * 7]);
                auVar55._0_8_ = ABS(local_1f0.p[lVar35 + lVar41 + lVar19 + local_1f0.nstride]);
                auVar55._8_8_ = ABS(local_1f0.p[lVar35 + lVar41 + lVar19 + local_1f0.nstride * 2]);
                auVar82._8_4_ = SUB84(dVar126,0);
                auVar82._0_8_ = dVar126;
                auVar82._12_4_ = (int)((ulong)dVar126 >> 0x20);
                auVar83._8_4_ = SUB84(dVar67,0);
                auVar83._0_8_ = dVar67;
                auVar83._12_4_ = (int)((ulong)dVar67 >> 0x20);
                auVar101._0_8_ =
                     dVar129 + dVar126 + ABS(local_1f0.p
                                             [lVar15 + lVar41 + lVar18 + local_1f0.nstride * 7]) +
                     dVar67 + 1e-100;
                auVar101._8_8_ =
                     dVar146 + auVar82._8_8_ +
                               ABS(local_1f0.p[lVar35 + lVar29 + lVar18 + local_1f0.nstride * 7]) +
                     auVar83._8_8_ + 1e-100;
                auVar188 = divpd(auVar55,auVar101);
                auVar84._0_8_ = ABS(local_1f0.p[lVar35 + lVar41 + lVar19 + local_1f0.nstride * 4]);
                auVar84._8_8_ = ABS(local_1f0.p[lVar35 + lVar41 + lVar19 + local_1f0.nstride * 3]);
                auVar128._0_8_ = dVar126 + dVar67 + 1e-100;
                auVar128._8_8_ =
                     dVar129 + ABS(local_1f0.p[lVar15 + lVar29 + lVar19 + local_1f0.nstride * 7]) +
                     dVar146 + auVar83._8_8_ + 1e-100;
                auVar85 = divpd(auVar84,auVar128);
                auVar86._0_8_ = ABS(local_1f0.p[lVar35 + lVar41 + lVar19 + local_1f0.nstride * 6]);
                auVar86._8_8_ = ABS(local_1f0.p[lVar35 + lVar41 + lVar19 + local_1f0.nstride * 5]);
                auVar116._0_8_ = dVar146 + dVar67 + 1e-100;
                auVar116._8_8_ = dVar67 + dVar129 + 1e-100;
                auVar87 = divpd(auVar86,auVar116);
                dVar56 = ((auVar87._8_8_ +
                           auVar85._8_8_ + auVar188._8_8_ + auVar188._0_8_ + 1.0 + auVar85._0_8_ +
                          auVar87._0_8_) * dVar67 * (double)local_498.p[lVar23 + lVar38 + lVar25] *
                          local_1f0.p[lVar35 + lVar41 + lVar19 + local_1f0.nstride * 8] +
                         (auVar183._8_8_ +
                          auVar69._8_8_ + auVar173._8_8_ + 1.0 + auVar173._0_8_ + auVar69._0_8_ +
                         auVar183._0_8_) * dVar125 * (double)local_260[lVar25] *
                         local_1f0.p[lVar35 + lVar32 + lVar19 + local_1f0.nstride * 8] +
                         (auVar149._8_8_ +
                          auVar197._8_8_ + auVar166._8_8_ + auVar166._0_8_ + 1.0 + auVar197._0_8_ +
                         auVar149._0_8_) * dVar134 * (double)local_320[lVar38 + lVar25] *
                         local_2e0[lVar19 + local_1f0.nstride * 8] +
                         (auVar114._8_8_ +
                          auVar138._8_8_ + auVar100._8_8_ + 1.0 + auVar100._0_8_ + auVar138._0_8_ +
                         auVar114._0_8_) * dVar124 * (double)local_270[lVar25] *
                         local_280[lVar19 + local_1f0.nstride * 8] +
                         (auVar157._8_8_ +
                          auVar190._8_8_ +
                          ABS(local_1f0.p[lVar35 + lVar41 + lVar20 + local_1f0.nstride * 2]) /
                          (ABS(local_1f0.p[lVar35 + lVar29 + lVar20 + local_1f0.nstride * 7]) +
                           dVar200 + dVar110 + 1e-100) +
                          ABS(local_1f0.p[lVar35 + lVar41 + lVar20 + local_1f0.nstride]) /
                          (dVar201 + ABS(local_1f0.p
                                         [lVar15 + lVar41 + lVar20 + local_1f0.nstride * 7]) +
                           dVar110 + 1e-100) + 1.0 + auVar190._0_8_ + auVar157._0_8_) * dVar117 *
                         (double)local_498.p[lVar23 + lVar38 + lVar43] *
                         local_1f0.p[lVar35 + lVar41 + lVar20 + local_1f0.nstride * 8] +
                         (auVar170._8_8_ +
                          auVar136._8_8_ +
                          ABS(local_1f0.p[lVar35 + lVar32 + lVar20 + local_1f0.nstride * 2]) /
                          (dVar145 + dVar174 +
                           ABS(local_1f0.p[lVar35 + lVar32 + lVar20 + local_1f0.nstride * 7]) +
                          1e-100) + ABS(local_1f0.p[lVar35 + lVar31 + lVar20 + local_1f0.nstride]) /
                                    (dVar178 + ABS(local_2d8[lVar20 + local_1f0.nstride * 7]) +
                                     dVar145 + 1e-100) + 1.0 + auVar136._0_8_ + auVar170._0_8_) *
                         dVar179 * (double)local_260[lVar43] *
                         local_1f0.p[lVar35 + lVar32 + lVar20 + local_1f0.nstride * 8] +
                         (auVar155._8_8_ +
                          ABS(local_2f8[local_1f0.nstride * 3]) /
                          (ABS(local_2f8[local_1f0.nstride * 7]) + ABS(_kk) + dVar109 + 1e-100) +
                          ABS(local_318[local_1f0.nstride * 2]) /
                          (ABS(local_310[local_1f0.nstride * 7]) + dVar109 + dVar162 + 1e-100) +
                          ABS(local_2e0[lVar20 + local_1f0.nstride]) /
                          (dVar123 + dVar162 + ABS(local_2e0[lVar20 + local_1f0.nstride * 7]) +
                          1e-100) + 1.0 +
                          ABS(local_318[local_1f0.nstride * 4]) / (dVar184 + dVar162 + 1e-100) +
                         auVar155._0_8_) * dVar184 * (double)local_320[lVar38 + lVar43] *
                         local_2e0[lVar20 + local_1f0.nstride * 8] +
                         (auVar168._8_8_ +
                          ABS(local_308[local_1f0.nstride * 3]) /
                          (ABS(local_2f0[lVar13 + local_1f0.nstride * 7]) + dVar53 +
                           ABS(local_308[local_1f0.nstride * 7]) + 1e-100) +
                          ABS(local_1f0.p[lVar40 + lVar32 + lVar20 + local_1f0.nstride * 2]) /
                          (dVar144 + dVar53 +
                           ABS(local_1f0.p[lVar40 + lVar32 + lVar20 + local_1f0.nstride * 7]) +
                          1e-100) + ABS(local_2f0[lVar20 + local_1f0.nstride]) /
                                    (dVar79 + dVar144 + ABS(local_3c8) + 1e-100) + 1.0 +
                          ABS(local_2e8[local_1f0.nstride * 4]) / (dVar161 + dVar144 + 1e-100) +
                         auVar168._0_8_) * dVar161 * (double)local_270[lVar43] *
                         local_280[lVar20 + local_1f0.nstride * 8] +
                         auVar93._8_8_ +
                         auVar164._8_8_ +
                         ((double)local_498.p[lVar12 + lVar45 + lVar43] * dVar52) /
                         ((dVar160 + dVar108) * dVar143 + dVar52 + (dVar78 + dVar177) * dVar99 +
                          (dVar108 + dVar177) * dVar122 + 1e-100) +
                         (dVar50 * (double)local_498.p[lVar12 + lVar38 + lVar43]) /
                         ((dVar98 + dVar66) * dVar159 + dVar50 + (dVar98 + dVar107) * dVar49 +
                          (dVar75 + dVar107) * dVar65 + 1e-100) +
                         ((double)local_498.p[lVar12 + lVar45 + lVar25] * dVar51) /
                         (dVar51 + (dVar199 + dVar186) * dVar153 + (dVar176 + dVar199) * dVar106 +
                          (dVar186 + dVar77) * dVar76 + 1e-100) +
                         ((double)local_498.p[lVar12 + lVar38 + lVar25] * dVar175) /
                         (dVar175 + (dVar92 + dVar198) * dVar74 +
                                    (dVar193 + dVar152) * dVar185 + (dVar92 + dVar193) * dVar64 +
                         1e-100) + ((double)local_270[lVar26] * dVar105) /
                                   ((dVar97 + dVar91) * dVar133 + dVar105 +
                                    (dVar73 + dVar142) * dVar48 + (dVar91 + dVar142) * dVar121 +
                                   1e-100) + (dVar132 * (double)local_320[lVar38 + lVar26]) /
                                             ((dVar72 + dVar63) * dVar104 + dVar132 +
                                              (dVar72 + dVar141) * dVar96 +
                                              (dVar90 + dVar141) * dVar120 + 1e-100) +
                                             ((double)local_260[lVar26] * dVar47) /
                                             (dVar47 + (dVar119 + dVar89) * dVar131 +
                                                       (dVar71 + dVar119) * dVar95 +
                                              (dVar89 + dVar140) * dVar103 + 1e-100) +
                                             ((double)local_498.p[lVar23 + lVar38 + lVar26] *
                                             dVar102) /
                                             (dVar102 + (dVar70 + dVar139) * dVar62 +
                                                        (dVar130 + dVar88) * dVar118 +
                                                        (dVar70 + dVar130) * dVar94 + 1e-100) +
                                             (double)local_498.p[lVar12 + lVar27 + lVar26] + dVar56
                                             + dVar57 + dVar58 + dVar59 + dVar60 + dVar61 +
                         auVar164._0_8_ + auVar93._0_8_) * 0.125;
              }
              local_330[lVar33 - local_4e8] = dVar56;
              lVar33 = lVar33 + 1;
            } while (local_534.bigend.vect[0] + 1U != (int)lVar33);
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
MLNodeLaplacian::restriction (int amrlev, int cmglev, MultiFab& crse, MultiFab& fine) const
{
    BL_PROFILE("MLNodeLaplacian::restriction()");

    applyBC(amrlev, cmglev-1, fine, BCMode::Homogeneous, StateMode::Solution);

    bool need_parallel_copy = !amrex::isMFIterSafe(crse, fine);
    MultiFab cfine;
    if (need_parallel_copy) {
        const BoxArray& ba = amrex::coarsen(fine.boxArray(), 2);
        cfine.define(ba, fine.DistributionMap(), 1, 0);
    }

    MultiFab* pcrse = (need_parallel_copy) ? &cfine : &crse;
    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][cmglev-1];

    const auto& stencil = m_stencil[amrlev][cmglev-1];

    bool regular_coarsening = true; int idir = 2;
    if (cmglev > 0) {
        regular_coarsening = mg_coarsen_ratio_vec[cmglev-1] == mg_coarsen_ratio;
        IntVect ratio = mg_coarsen_ratio_vec[cmglev-1];
        if (ratio[1] == 1) {
            idir = 1;
        } else if (ratio[0] == 1) {
            idir = 0;
        }
    }

#ifdef AMREX_USE_GPU
    auto pcrse_ma = pcrse->arrays();
    auto fine_ma = fine.const_arrays();
    auto msk_ma = dmsk.const_arrays();

    if (Gpu::inLaunchRegion()) {
        if (m_coarsening_strategy == CoarseningStrategy::Sigma)
        {
            if (regular_coarsening)
            {
                ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
                {
                    mlndlap_restriction(i,j,k,pcrse_ma[box_no],fine_ma[box_no],msk_ma[box_no]);
                });
            }
            else
            {
                ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
                {
                    mlndlap_semi_restriction(i,j,k,pcrse_ma[box_no],fine_ma[box_no],msk_ma[box_no],idir);
                });
            }
        }
        else
        {
            auto st_ma = stencil->const_arrays();
            ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
                mlndlap_restriction_rap(i,j,k,pcrse_ma[box_no],fine_ma[box_no],st_ma[box_no],msk_ma[box_no]);
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*pcrse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> cfab = pcrse->array(mfi);
            Array4<Real const> const& ffab = fine.const_array(mfi);
            Array4<int const> const& mfab = dmsk.const_array(mfi);
            if (m_coarsening_strategy == CoarseningStrategy::Sigma)
            {
                if (regular_coarsening)
                {
                    amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                    {
                        mlndlap_restriction(i,j,k,cfab,ffab,mfab);
                    });
                }
                else
                {
                    amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                    {
                        mlndlap_semi_restriction(i,j,k,cfab,ffab,mfab,idir);
                    });
                }
            }
            else
            {
                Array4<Real const> const& stfab = stencil->const_array(mfi);
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    mlndlap_restriction_rap(i,j,k,cfab,ffab,stfab,mfab);
                });
            }
        }
    }

    if (need_parallel_copy) {
        crse.ParallelCopy(cfine);
    }
}